

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

uint get_input_line(char **string,uint option)

{
  bool bVar1;
  int iVar2;
  char *__s;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  
  __s = vrna_read_line(_stdin);
  uVar7 = 1;
  if (__s != (char *)0x0) {
    if ((char)option < '\0') {
LAB_0012ac3b:
      if (*__s == '@') {
        free(__s);
        uVar7 = 2;
      }
      else {
        if ((option >> 8 & 1) == 0) {
          uVar3 = strlen(__s);
          if (0 < (int)(uint)uVar3) {
            uVar3 = (ulong)((uint)uVar3 & 0x7fffffff);
            do {
              if ((__s[uVar3 - 1] != ' ') && (__s[uVar3 - 1] != '\t')) goto LAB_0012ac8a;
              bVar1 = 1 < (long)uVar3;
              uVar3 = uVar3 - 1;
            } while (bVar1);
            uVar3 = 0;
          }
LAB_0012ac8a:
          uVar6 = 0;
          if (0 < (int)uVar3) {
            uVar6 = uVar3 & 0xffffffff;
          }
          __s[uVar6] = '\0';
        }
        if (*__s == '>') {
          sVar4 = strlen(__s);
          pcVar5 = (char *)vrna_alloc((int)sVar4 + 1);
          *string = pcVar5;
          iVar2 = __isoc99_sscanf(__s,">%s",pcVar5);
          if (iVar2 < 1) {
            free(__s);
            free(*string);
            *string = (char *)0x0;
          }
          else {
            pcVar5 = *string;
            sVar4 = strlen(pcVar5);
            pcVar5 = (char *)vrna_realloc(pcVar5,(int)sVar4 + 1);
            *string = pcVar5;
            free(__s);
            uVar7 = 8;
          }
        }
        else {
          pcVar5 = strdup(__s);
          *string = pcVar5;
          free(__s);
          uVar7 = 4;
        }
      }
    }
    else {
      do {
        if ((*__s != '*') && (*__s != '\0')) goto LAB_0012ac3b;
        free(__s);
        __s = vrna_read_line(_stdin);
      } while (__s != (char *)0x0);
    }
  }
  return uVar7;
}

Assistant:

PUBLIC unsigned int
get_input_line(char         **string,
               unsigned int option)
{
  char  *line;
  int   i, l, r;

  /*
   * read lines until informative data appears or
   * report an error if anything goes wrong
   */
  if ((line = vrna_read_line(stdin)) == NULL)
    return VRNA_INPUT_ERROR;

  if (!(option & VRNA_INPUT_NOSKIP_COMMENTS)) {
    while ((*line == '*') || (*line == '\0')) {
      free(line);
      if ((line = vrna_read_line(stdin)) == NULL)
        return VRNA_INPUT_ERROR;
    }
  }

  l = (int)strlen(line);

  /* break on '@' sign if not disabled */
  if (*line == '@') {
    free(line);
    return VRNA_INPUT_QUIT;
  }

  /* print line read if not disabled */
  /* if(!(option & VRNA_INPUT_NOPRINT)) printf("%s\n", line); */

  /* eliminate whitespaces at the end of the line read */
  if (!(option & VRNA_INPUT_NO_TRUNCATION)) {
    for (i = l - 1; i >= 0; i--) {
      if (line[i] == ' ')
        continue;
      else if (line[i] == '\t')
        continue;
      else
        break;
    }
    line[(i >= 0) ? (i + 1) : 0] = '\0';
  }

  if (*line == '>') {
    /* fasta header */
    /* alloc memory for the string */
    *string = (char *)vrna_alloc(sizeof(char) * (strlen(line) + 1));
    r       = VRNA_INPUT_FASTA_HEADER;
    i       = sscanf(line, ">%s", *string);
    if (i > 0) {
      i       = (int)strlen(*string);
      *string = (char *)vrna_realloc(*string, (i + 1) * sizeof(char));
      free(line);
      return r;
    } else {
      free(line);
      free(*string);
      *string = NULL;
      return VRNA_INPUT_ERROR;
    }
  } else {
    *string = strdup(line);
    free(line);
  }

  return VRNA_INPUT_MISC;
}